

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_table_activate_mask(PSH_Hint_Table table,PS_Mask hint_mask)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  PSH_Hint_conflict pPVar4;
  PSH_Hint_conflict *ppPVar5;
  FT_UInt *pFVar6;
  byte *in_RDX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar1 = table->max_hints;
  if (uVar1 != 0) {
    pFVar6 = &table->hints->flags;
    uVar9 = uVar1;
    do {
      *(byte *)pFVar6 = (byte)*pFVar6 & 0xfb;
      pFVar6[4] = -1;
      pFVar6 = pFVar6 + 0xc;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if ((int)hint_mask == 0) {
    table->num_hints = 0;
  }
  else {
    lVar10 = 0;
    uVar13 = 0;
    uVar11 = 0;
    uVar9 = 0;
    do {
      if (uVar13 == 0) {
        uVar11 = (uint)*in_RDX;
        in_RDX = in_RDX + 1;
        uVar13 = 0x80;
      }
      if ((uVar13 & uVar11) != 0) {
        pPVar4 = table->hints;
        uVar2 = *(uint *)((long)&pPVar4->flags + lVar10);
        if (((uVar2 & 4) == 0) &&
           (*(uint *)((long)&pPVar4->flags + lVar10) = uVar2 | 4, uVar9 < uVar1)) {
          uVar7 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
          table->sort[uVar7] = (PSH_Hint_conflict)((long)&pPVar4->org_pos + lVar10);
        }
      }
      uVar13 = uVar13 >> 1;
      lVar10 = lVar10 + 0x30;
    } while (((ulong)hint_mask & 0xffffffff) * 0x30 != lVar10);
    table->num_hints = uVar9;
    if (1 < (int)uVar9) {
      ppPVar5 = table->sort;
      uVar7 = 1;
      uVar8 = 0;
      do {
        pPVar4 = ppPVar5[uVar7];
        iVar3 = pPVar4->org_pos;
        uVar12 = uVar8;
        do {
          if (ppPVar5[uVar12 & 0xffffffff]->org_pos < iVar3) break;
          ppPVar5[uVar12 + 1] = ppPVar5[uVar12 & 0xffffffff];
          ppPVar5[uVar12 & 0xffffffff] = pPVar4;
          lVar10 = uVar12 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < lVar10);
        uVar7 = uVar7 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar9);
    }
  }
  return;
}

Assistant:

static void
  psh_hint_table_activate_mask( PSH_Hint_Table  table,
                                PS_Mask         hint_mask )
  {
    FT_Int    mask = 0, val = 0;
    FT_Byte*  cursor = hint_mask->bytes;
    FT_UInt   idx, limit, count;


    limit = hint_mask->num_bits;
    count = 0;

    psh_hint_table_deactivate( table );

    for ( idx = 0; idx < limit; idx++ )
    {
      if ( mask == 0 )
      {
        val  = *cursor++;
        mask = 0x80;
      }

      if ( val & mask )
      {
        PSH_Hint  hint = &table->hints[idx];


        if ( !psh_hint_is_active( hint ) )
        {
          FT_UInt     count2;

#if 0
          PSH_Hint*  sort = table->sort;
          PSH_Hint   hint2;


          for ( count2 = count; count2 > 0; count2--, sort++ )
          {
            hint2 = sort[0];
            if ( psh_hint_overlap( hint, hint2 ) )
              FT_TRACE0(( "psh_hint_table_activate_mask:"
                          " found overlapping hints\n" ))
          }
#else
          count2 = 0;
#endif

          if ( count2 == 0 )
          {
            psh_hint_activate( hint );
            if ( count < table->max_hints )
              table->sort[count++] = hint;
            else
              FT_TRACE0(( "psh_hint_tableactivate_mask:"
                          " too many active hints\n" ));
          }
        }
      }

      mask >>= 1;
    }
    table->num_hints = count;

    /* now, sort the hints; they are guaranteed to not overlap */
    /* so we can compare their "org_pos" field directly        */
    {
      FT_Int     i1, i2;
      PSH_Hint   hint1, hint2;
      PSH_Hint*  sort = table->sort;


      /* a simple bubble sort will do, since in 99% of cases, the hints */
      /* will be already sorted -- and the sort will be linear          */
      for ( i1 = 1; i1 < (FT_Int)count; i1++ )
      {
        hint1 = sort[i1];
        for ( i2 = i1 - 1; i2 >= 0; i2-- )
        {
          hint2 = sort[i2];

          if ( hint2->org_pos < hint1->org_pos )
            break;

          sort[i2 + 1] = hint2;
          sort[i2]     = hint1;
        }
      }
    }
  }